

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateColumn
          (HtmlparserCppTest *this,string *expected_column)

{
  bool bVar1;
  int iVar2;
  int local_1c;
  string *psStack_18;
  int column;
  string *expected_column_local;
  HtmlparserCppTest *this_local;
  
  psStack_18 = expected_column;
  expected_column_local = (string *)this;
  bVar1 = safe_strto32(expected_column,&local_1c);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","safe_strto32(expected_column, &column)");
    exit(1);
  }
  iVar2 = HtmlParser::column_number(&this->parser_);
  if (local_1c != iVar2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","column","==","parser_.column_number()");
    exit(1);
  }
  return;
}

Assistant:

void HtmlparserCppTest::ValidateColumn(const string &expected_column) {
  int column;
  CHECK(safe_strto32(expected_column, &column));
  EXPECT_EQ(column, parser_.column_number())
      << "Unexpected column count at line " << parser_.line_number();
}